

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  TransformerLinLog *pTVar1;
  bool bVar2;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  ImPlotPoint local_68;
  ImVec2 local_58;
  ImVec2 P2;
  ImVec2 local_3c;
  ImVec2 P1;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  LineSegmentsRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLog>
  *this_local;
  
  pTVar1 = this->Transformer;
  P1.x = (float)prim;
  unique0x1000012e = uv;
  _P2 = GetterYs<unsigned_short>::operator()(this->Getter1,prim);
  local_3c = TransformerLinLog::operator()(pTVar1,(ImPlotPoint *)&P2);
  pTVar1 = this->Transformer;
  local_68 = GetterYRef::operator()(this->Getter2,(int)P1.x);
  local_58 = TransformerLinLog::operator()(pTVar1,&local_68);
  local_80 = ImMin(&local_3c,&local_58);
  local_88 = ImMax(&local_3c,&local_58);
  ImRect::ImRect(&local_78,&local_80,&local_88);
  bVar2 = ImRect::Overlaps(cull_rect,&local_78);
  bVar2 = ((bVar2 ^ 0xffU) & 1) == 0;
  if (bVar2) {
    AddLine(&local_3c,&local_58,this->Weight,this->Col,DrawList,*stack0xffffffffffffffd0);
  }
  return bVar2;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }